

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharStringType2Tracer.cpp
# Opt level: O2

EStatusCode __thiscall
CharStringType2Tracer::Type2Index(CharStringType2Tracer *this,CharStringOperandList *inOperandList)

{
  allocator<char> local_31;
  string local_30;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"index",&local_31);
  PrimitiveObjectsWriter::WriteKeyword(&this->mPrimitiveWriter,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return eSuccess;
}

Assistant:

EStatusCode CharStringType2Tracer::Type2Index(const CharStringOperandList& inOperandList)
{
	mPrimitiveWriter.WriteKeyword("index");
	return eSuccess;
}